

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_parent(ext_key *hdkey,uint32_t child_num,uint32_t flags,ext_key *key_out)

{
  _Bool _Var1;
  beint32_t bVar2;
  int iVar3;
  _Bool local_c1;
  size_t local_c0;
  size_t len;
  secp256k1_pubkey_conflict pub_key;
  _Bool hardened;
  _Bool derive_private;
  _Bool we_are_private;
  secp256k1_context *ctx;
  sha512 sha;
  ext_key *key_out_local;
  uint32_t flags_local;
  uint32_t child_num_local;
  ext_key *hdkey_local;
  
  local_c1 = false;
  sha.u.u64[7] = (uint64_t)key_out;
  if (hdkey != (ext_key *)0x0) {
    local_c1 = key_is_private(hdkey);
  }
  pub_key.data[0x3a] = local_c1;
  pub_key.data[0x39] = ((flags & 1) != 0 ^ 0xffU) & 1;
  pub_key.data[0x38] = child_is_hardened(child_num);
  if ((flags & 0xfffffff8) == 0) {
    if ((hdkey == (ext_key *)0x0) || (sha.u.u64[7] == 0)) {
      hdkey_local._4_4_ = -2;
    }
    else {
      register0x00000000 = secp_ctx();
      if (register0x00000000 == (secp256k1_context *)0x0) {
        hdkey_local._4_4_ = -3;
      }
      else if (((pub_key.data[0x3a] & 1) == 0) &&
              (((pub_key.data[0x39] & 1) != 0 || ((pub_key.data[0x38] & 1) != 0)))) {
        hdkey_local._4_4_ = wipe_key_fail((ext_key *)sha.u.u64[7]);
      }
      else if (hdkey->depth == 0xff) {
        hdkey_local._4_4_ = wipe_key_fail((ext_key *)sha.u.u64[7]);
      }
      else {
        if ((pub_key.data[0x38] & 1) == 0) {
          memcpy((void *)(sha.u.u64[7] + 0x3f),hdkey->pub_key,0x21);
        }
        else {
          memcpy((void *)(sha.u.u64[7] + 0x3f),hdkey->priv_key,0x21);
        }
        bVar2 = cpu_to_be32(child_num);
        *(beint32_t *)(sha.u.u64[7] + 0x60) = bVar2;
        hmac_sha512_impl((sha512 *)&ctx,hdkey->chain_code,0x20,(uchar *)(sha.u.u64[7] + 0x3f),0x25);
        *(uint64_t *)sha.u.u64[7] = sha.u.u64[3];
        *(uint64_t *)(sha.u.u64[7] + 8) = sha.u.u64[4];
        *(uint64_t *)(sha.u.u64[7] + 0x10) = sha.u.u64[5];
        *(uint64_t *)(sha.u.u64[7] + 0x18) = sha.u.u64[6];
        if ((pub_key.data[0x3a] & 1) == 0) {
          local_c0 = 0x21;
          iVar3 = pubkey_parse((secp256k1_pubkey_conflict *)((long)&len + 5),hdkey->pub_key,0x21);
          if ((((iVar3 == 0) ||
               (iVar3 = secp256k1_ec_pubkey_tweak_add
                                  (stack0xffffffffffffff90,
                                   (secp256k1_pubkey_conflict *)((long)&len + 5),(uchar *)&ctx),
               iVar3 == 0)) ||
              (iVar3 = pubkey_serialize((uchar *)(sha.u.u64[7] + 0x7f),&local_c0,
                                        (secp256k1_pubkey_conflict *)((long)&len + 5),0x102),
              iVar3 == 0)) ||
             ((local_c0 != 0x21 ||
              (((flags & 4) != 0 &&
               (iVar3 = bip32_privkey_tweak_add((uchar *)&ctx,0x20,(ext_key *)sha.u.u64[7]),
               iVar3 != 0)))))) {
            wally_clear(&ctx,0x40);
            iVar3 = wipe_key_fail((ext_key *)sha.u.u64[7]);
            return iVar3;
          }
        }
        else {
          memcpy((void *)(sha.u.u64[7] + 0x3f),hdkey->priv_key,0x21);
          iVar3 = privkey_tweak_add((uchar *)(sha.u.u64[7] + 0x40),(uchar *)&ctx);
          if (iVar3 == 0) {
            wally_clear(&ctx,0x40);
            iVar3 = wipe_key_fail((ext_key *)sha.u.u64[7]);
            return iVar3;
          }
          iVar3 = key_compute_pub_key((ext_key *)sha.u.u64[7]);
          if (iVar3 != 0) {
            wally_clear(&ctx,0x40);
            iVar3 = wipe_key_fail((ext_key *)sha.u.u64[7]);
            return iVar3;
          }
        }
        if ((pub_key.data[0x39] & 1) == 0) {
          _Var1 = version_is_mainnet(hdkey->version);
          if (_Var1) {
            *(undefined4 *)(sha.u.u64[7] + 0x78) = 0x488b21e;
          }
          else {
            *(undefined4 *)(sha.u.u64[7] + 0x78) = 0x43587cf;
          }
          bip32_key_strip_private_key((ext_key *)sha.u.u64[7]);
        }
        else {
          _Var1 = version_is_mainnet(hdkey->version);
          if (_Var1) {
            *(undefined4 *)(sha.u.u64[7] + 0x78) = 0x488ade4;
          }
          else {
            *(undefined4 *)(sha.u.u64[7] + 0x78) = 0x4358394;
          }
        }
        *(uint8_t *)(sha.u.u64[7] + 0x34) = hdkey->depth + '\x01';
        *(uint32_t *)(sha.u.u64[7] + 0x60) = child_num;
        if ((flags & 2) == 0) {
          *(undefined8 *)(sha.u.u64[7] + 0x20) = *(undefined8 *)hdkey->hash160;
          *(undefined8 *)(sha.u.u64[7] + 0x28) = *(undefined8 *)(hdkey->hash160 + 8);
          *(undefined4 *)(sha.u.u64[7] + 0x30) = *(undefined4 *)(hdkey->hash160 + 0x10);
          key_compute_hash160((ext_key *)sha.u.u64[7]);
        }
        else {
          wally_clear_2((void *)(sha.u.u64[7] + 0x20),0x14,(void *)(sha.u.u64[7] + 100),0x14);
        }
        wally_clear(&ctx,0x40);
        hdkey_local._4_4_ = 0;
      }
    }
  }
  else {
    hdkey_local._4_4_ = -2;
  }
  return hdkey_local._4_4_;
}

Assistant:

int bip32_key_from_parent(const struct ext_key *hdkey, uint32_t child_num,
                          uint32_t flags, struct ext_key *key_out)
{
    struct sha512 sha;
    const secp256k1_context *ctx;
    const bool we_are_private = hdkey && key_is_private(hdkey);
    const bool derive_private = !(flags & BIP32_FLAG_KEY_PUBLIC);
    const bool hardened = child_is_hardened(child_num);

    if (flags & ~BIP32_ALL_DEFINED_FLAGS)
        return WALLY_EINVAL; /* These flags are not defined yet */

    if (!hdkey || !key_out)
        return WALLY_EINVAL;

    if (!(ctx = secp_ctx()))
        return WALLY_ENOMEM;

    if (!we_are_private && (derive_private || hardened))
        return wipe_key_fail(key_out); /* Unsupported derivation */

    if (hdkey->depth == 0xff)
        return wipe_key_fail(key_out); /* Maximum depth reached */

    /*
     *  Private parent -> private child:
     *    CKDpriv((kpar, cpar), i) -> (ki, ci)
     *
     *  Private parent -> public child:
     *    N(CKDpriv((kpar, cpar), i) -> (ki, ci))
     *  As we always calculate the public key, we can derive a public
     *  child by deriving a private one and stripping its private key.
     *
     * Public parent -> non hardened public child
     *    CKDpub((Kpar, cpar), i) -> (Ki, ci)
     */

    /* NB: We use the key_outs' priv_key+child_num to hold 'Data' here */
    if (hardened) {
        /* Hardened: Data = 0x00 || ser256(kpar) || ser32(i)) */
        memcpy(key_out->priv_key, hdkey->priv_key, sizeof(hdkey->priv_key));
    } else {
        /* Non Hardened Private: Data = serP(point(kpar)) || ser32(i)
         * Non Hardened Public : Data = serP(kpar) || ser32(i)
         *   point(kpar) when par is private is the public key.
         */
        memcpy(key_out->priv_key, hdkey->pub_key, sizeof(hdkey->pub_key));
    }

    /* This is the '|| ser32(i)' part of the above */
    key_out->child_num = cpu_to_be32(child_num);

    /* I = HMAC-SHA512(Key = cpar, Data) */
    hmac_sha512_impl(&sha, hdkey->chain_code, sizeof(hdkey->chain_code),
                     key_out->priv_key,
                     sizeof(key_out->priv_key) + sizeof(key_out->child_num));

    /* Split I into two 32-byte sequences, IL and IR
     * The returned chain code ci is IR (i.e. the 2nd half of our hmac sha512)
     */
    memcpy(key_out->chain_code, sha.u.u8 + sizeof(sha) / 2,
           sizeof(key_out->chain_code));

    if (we_are_private) {
        /* The returned child key ki is parse256(IL) + kpar (mod n)
         * In case parse256(IL) ≥ n or ki = 0, the resulting key is invalid
         * (NOTE: privkey_tweak_add checks both conditions)
         */
        memcpy(key_out->priv_key, hdkey->priv_key, sizeof(hdkey->priv_key));
        if (!privkey_tweak_add(key_out->priv_key + 1, sha.u.u8)) {
            wally_clear(&sha, sizeof(sha));
            return wipe_key_fail(key_out); /* Out of bounds FIXME: Iterate to the next? */
        }

        if (key_compute_pub_key(key_out) != WALLY_OK) {
            wally_clear(&sha, sizeof(sha));
            return wipe_key_fail(key_out);
        }
    } else {
        /* The returned child key ki is point(parse256(IL) + kpar)
         * In case parse256(IL) ≥ n or Ki is the point at infinity, the
         * resulting key is invalid (NOTE: pubkey_tweak_add checks both
         * conditions)
         */
        secp256k1_pubkey pub_key;
        size_t len = sizeof(key_out->pub_key);

        /* FIXME: Out of bounds on pubkey_tweak_add */
        if (!pubkey_parse(&pub_key, hdkey->pub_key, sizeof(hdkey->pub_key)) ||
            !pubkey_tweak_add(ctx, &pub_key, sha.u.u8) ||
            !pubkey_serialize(key_out->pub_key, &len, &pub_key,
                              PUBKEY_COMPRESSED) ||
            len != sizeof(key_out->pub_key)
#ifdef BUILD_ELEMENTS
            || ((flags & BIP32_FLAG_KEY_TWEAK_SUM) &&
                bip32_privkey_tweak_add(sha.u.u8, SHA256_LEN, key_out) != WALLY_OK)
#endif /* BUILD_ELEMENTS */
            ) {
            wally_clear(&sha, sizeof(sha));
            return wipe_key_fail(key_out);
        }
    }

    if (derive_private) {
        if (version_is_mainnet(hdkey->version))
            key_out->version = BIP32_VER_MAIN_PRIVATE;
        else
            key_out->version = BIP32_VER_TEST_PRIVATE;

    } else {
        if (version_is_mainnet(hdkey->version))
            key_out->version = BIP32_VER_MAIN_PUBLIC;
        else
            key_out->version = BIP32_VER_TEST_PUBLIC;

        bip32_key_strip_private_key(key_out);
    }

    key_out->depth = hdkey->depth + 1;
    key_out->child_num = child_num;
    if (flags & BIP32_FLAG_SKIP_HASH)
        wally_clear_2(&key_out->parent160, sizeof(key_out->parent160),
                      &key_out->hash160, sizeof(key_out->hash160));
    else {
        memcpy(key_out->parent160, hdkey->hash160, sizeof(hdkey->hash160));
        key_compute_hash160(key_out);
    }
    wally_clear(&sha, sizeof(sha));
    return WALLY_OK;
}